

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

CallRef * __thiscall
wasm::Builder::makeCallRef<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,Expression *target,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args,Type type,
          bool isReturn)

{
  Module *pMVar1;
  CallRef *pCVar2;
  
  pMVar1 = this->wasm;
  pCVar2 = (CallRef *)MixedArena::allocSpace((MixedArena *)(pMVar1 + 0x200),0x40,8);
  (pCVar2->super_SpecificExpression<(wasm::Expression::Id)61>).super_Expression._id = CallRefId;
  (pCVar2->super_SpecificExpression<(wasm::Expression::Id)61>).super_Expression.type.id = 0;
  (pCVar2->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
       = (Expression **)0x0;
  (pCVar2->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  usedElements = 0;
  (pCVar2->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
  allocatedElements = 0;
  (pCVar2->operands).allocator = (MixedArena *)(pMVar1 + 0x200);
  pCVar2->isReturn = false;
  (pCVar2->super_SpecificExpression<(wasm::Expression::Id)61>).super_Expression.type.id = type.id;
  pCVar2->target = target;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)&pCVar2->operands,
             args);
  pCVar2->isReturn = isReturn;
  wasm::CallRef::finalize();
  return pCVar2;
}

Assistant:

CallRef* makeCallRef(Expression* target,
                       const T& args,
                       Type type,
                       bool isReturn = false) {
    auto* call = wasm.allocator.alloc<CallRef>();
    call->type = type;
    call->target = target;
    call->operands.set(args);
    call->isReturn = isReturn;
    call->finalize();
    return call;
  }